

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::MinTypMaxExpression::fromSyntax
          (Compilation *compilation,MinTypMaxExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  MinTypMax MVar1;
  MinTypMaxExpression *args_3;
  MinTypMaxExpression *args_2;
  MinTypMaxExpression *args_1;
  MinTypMaxExpressionSyntax *pMVar2;
  bool bVar3;
  CompilationOptions *pCVar4;
  ExpressionSyntax *pEVar5;
  Type *pTVar6;
  SourceRange local_98;
  Compilation *local_88;
  MinTypMaxExpression *result;
  Expression *selected;
  MinTypMaxExpression *local_70;
  Expression *max;
  MinTypMaxExpression *local_60;
  Expression *typ;
  MinTypMaxExpression *local_50;
  Expression *min;
  ASTFlags maxFlags;
  ASTFlags typFlags;
  ASTFlags minFlags;
  Type *assignmentTarget_local;
  ASTContext *context_local;
  MinTypMaxExpressionSyntax *syntax_local;
  Compilation *compilation_local;
  
  typFlags = UnevaluatedBranch;
  maxFlags = UnevaluatedBranch;
  min = (Expression *)0x2;
  minFlags = (ASTFlags)assignmentTarget;
  assignmentTarget_local = (Type *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (MinTypMaxExpressionSyntax *)compilation;
  pCVar4 = Compilation::getOptions(compilation);
  pMVar2 = syntax_local;
  MVar1 = pCVar4->minTypMax;
  if (MVar1 == Min) {
    typFlags = None;
  }
  else if (MVar1 == Typ) {
    maxFlags = None;
  }
  else if (MVar1 == Max) {
    min = (Expression *)0x0;
  }
  pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)&context_local->flags);
  pTVar6 = assignmentTarget_local;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&typ,typFlags);
  local_50 = (MinTypMaxExpression *)
             Expression::create((Compilation *)pMVar2,pEVar5,(ASTContext *)pTVar6,
                                (bitmask<slang::ast::ASTFlags>)typ,(Type *)minFlags);
  pMVar2 = syntax_local;
  pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)
                      &context_local->randomizeDetails);
  pTVar6 = assignmentTarget_local;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&max,maxFlags);
  local_60 = (MinTypMaxExpression *)
             Expression::create((Compilation *)pMVar2,pEVar5,(ASTContext *)pTVar6,
                                (bitmask<slang::ast::ASTFlags>)max,(Type *)minFlags);
  pMVar2 = syntax_local;
  pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)&context_local[1].lookupIndex);
  pTVar6 = assignmentTarget_local;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&selected,(ASTFlags)min);
  local_70 = (MinTypMaxExpression *)
             Expression::create((Compilation *)pMVar2,pEVar5,(ASTContext *)pTVar6,
                                (bitmask<slang::ast::ASTFlags>)selected,(Type *)minFlags);
  result = (MinTypMaxExpression *)0x0;
  pCVar4 = Compilation::getOptions((Compilation *)syntax_local);
  pMVar2 = syntax_local;
  MVar1 = pCVar4->minTypMax;
  if (MVar1 == Min) {
    result = local_50;
  }
  else if (MVar1 == Typ) {
    result = local_60;
  }
  else if (MVar1 == Max) {
    result = local_70;
  }
  pTVar6 = not_null<const_slang::ast::Type_*>::operator*(&(result->super_Expression).type);
  args_1 = local_50;
  args_2 = local_60;
  args_3 = local_70;
  local_98 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  local_88 = (Compilation *)
             BumpAllocator::
             emplace<slang::ast::MinTypMaxExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression*&,slang::SourceRange>
                       ((BumpAllocator *)pMVar2,pTVar6,&args_1->super_Expression,
                        &args_2->super_Expression,&args_3->super_Expression,(Expression **)&result,
                        &local_98);
  bVar3 = Expression::bad(&local_50->super_Expression);
  if (((bVar3) || (bVar3 = Expression::bad(&local_60->super_Expression), bVar3)) ||
     (bVar3 = Expression::bad(&local_70->super_Expression), bVar3)) {
    compilation_local =
         (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)local_88);
  }
  else {
    compilation_local = local_88;
  }
  return (Expression *)compilation_local;
}

Assistant:

Expression& MinTypMaxExpression::fromSyntax(Compilation& compilation,
                                            const MinTypMaxExpressionSyntax& syntax,
                                            const ASTContext& context,
                                            const Type* assignmentTarget) {
    // Only one of the expressions will be considered evaluated.
    auto minFlags = ASTFlags::UnevaluatedBranch;
    auto typFlags = ASTFlags::UnevaluatedBranch;
    auto maxFlags = ASTFlags::UnevaluatedBranch;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            minFlags = ASTFlags::None;
            break;
        case MinTypMax::Typ:
            typFlags = ASTFlags::None;
            break;
        case MinTypMax::Max:
            maxFlags = ASTFlags::None;
            break;
    }

    auto& min = create(compilation, *syntax.min, context, minFlags, assignmentTarget);
    auto& typ = create(compilation, *syntax.typ, context, typFlags, assignmentTarget);
    auto& max = create(compilation, *syntax.max, context, maxFlags, assignmentTarget);

    Expression* selected = nullptr;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            selected = &min;
            break;
        case MinTypMax::Typ:
            selected = &typ;
            break;
        case MinTypMax::Max:
            selected = &max;
            break;
    }

    auto result = compilation.emplace<MinTypMaxExpression>(*selected->type, min, typ, max, selected,
                                                           syntax.sourceRange());
    if (min.bad() || typ.bad() || max.bad())
        return badExpr(compilation, result);

    return *result;
}